

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
MipsParser::parseMacro(MipsParser *this,Parser *parser)

{
  MipsMacroDefinition *pMVar1;
  Tokenizer *this_00;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  int iVar6;
  Token *pTVar7;
  size_t __n;
  MipsRegisterData *in_RDX;
  MipsMacroDefinition *macro;
  char *__s;
  Token token;
  int iStack_88;
  _Variadic_union<std::monostate,_long,_double,_StringLiteral,_Identifier> local_80;
  char local_60;
  long *local_58 [2];
  long local_48 [3];
  
  this_00 = *(Tokenizer **)((in_RDX->grs).name._name._M_dataplus._M_p + -0x18);
  p_Var2 = (this_00->position).it._M_node;
  pTVar7 = Tokenizer::peekToken(this_00,0);
  iStack_88 = (int)((ulong)*(undefined8 *)((long)&pTVar7->column + 5) >> 0x18);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
             &local_80,
             (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
             &pTVar7->value);
  local_58[0] = local_48;
  pcVar3 = (pTVar7->originalText)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + (pTVar7->originalText)._M_string_length);
  if (iStack_88 == 1) {
    Tokenizer::eatTokens(*(Tokenizer **)((in_RDX->grs).name._name._M_dataplus._M_p + -0x18),1);
    if (local_60 != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    macro = mipsMacros;
    __s = "abs";
    while (__s != (char *)0x0) {
      __n = strlen(__s);
      if (local_80._8_8_ == __n) {
        if (__n != 0) {
          iVar6 = bcmp((void *)local_80._M_rest._0_8_,__s,__n);
          if (iVar6 != 0) goto LAB_00169bf6;
        }
        p_Var4 = (this_00->position).it._M_node;
        bVar5 = parseMacroParameters((MipsParser *)parser,(Parser *)in_RDX,macro);
        if (bVar5) {
          (*macro->function)((Parser *)this,in_RDX,(MipsImmediateData *)parser,(int)parser + 0x360);
          goto LAB_00169c15;
        }
        (this_00->position).it._M_node = p_Var4;
      }
LAB_00169bf6:
      pMVar1 = macro + 1;
      macro = macro + 1;
      __s = pMVar1->name;
    }
    (this_00->position).it._M_node = p_Var2;
  }
  *(undefined8 *)&(this->registers).grs = 0;
LAB_00169c15:
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_80);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> MipsParser::parseMacro(Parser& parser)
{
	Tokenizer* tokenizer = parser.getTokenizer();
	TokenizerPosition startPos = tokenizer->getPosition();

	// Cannot be a reference (we eat below.)
	const Token token = parser.peekToken();
	if (token.type != TokenType::Identifier)
		return nullptr;
	
	parser.eatToken();
	const Identifier &identifier = token.identifierValue();
	for (int z = 0; mipsMacros[z].name != nullptr; z++)
	{
		if (identifier == mipsMacros[z].name)
		{
			TokenizerPosition tokenPos = tokenizer->getPosition();

			if (parseMacroParameters(parser,mipsMacros[z]))
			{
				return mipsMacros[z].function(parser,registers,immediate,mipsMacros[z].flags);
			}

			tokenizer->setPosition(tokenPos);
		}
	}

	// no matching macro found, restore state
	tokenizer->setPosition(startPos);
	return nullptr;
}